

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_socket_wait(ENetSocket socket,uint32_t *condition,uint64_t timeout)

{
  int iVar1;
  int *piVar2;
  uint32_t uVar3;
  pollfd local_10;
  
  local_10.events = ((ushort)*condition >> 1 & 1) + ((ushort)*condition & 1) * 4;
  local_10.fd = socket;
  iVar1 = poll(&local_10,1,(int)timeout);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return -1;
    }
    uVar3 = 4;
    if ((*condition & 4) == 0) {
      return -1;
    }
  }
  else {
    *condition = 0;
    if (iVar1 == 0) {
      return 0;
    }
    uVar3 = 1;
    if ((local_10.revents & 1U) != 0) {
      uVar3 = 3 - ((local_10.revents & 4U) == 0);
    }
    if ((local_10.revents & 5U) == 0) {
      return 0;
    }
  }
  *condition = uVar3;
  return 0;
}

Assistant:

int enet_socket_wait(ENetSocket socket, uint32_t* condition, uint64_t timeout) {
	struct pollfd pollSocket;
	int pollCount;

	pollSocket.fd = socket;
	pollSocket.events = 0;

	if (*condition & ENET_SOCKET_WAIT_SEND)
		pollSocket.events |= POLLOUT;

	if (*condition & ENET_SOCKET_WAIT_RECEIVE)
		pollSocket.events |= POLLIN;

	pollCount = poll(&pollSocket, 1, timeout);

	if (pollCount < 0) {
		if (errno == EINTR && *condition & ENET_SOCKET_WAIT_INTERRUPT) {
			*condition = ENET_SOCKET_WAIT_INTERRUPT;

			return 0;
		}

		ENET_LOG_ERROR("Socket wait: pollCount < 0, %i", pollCount);
		return -1;
	}

	*condition = ENET_SOCKET_WAIT_NONE;

	if (pollCount == 0)
		return 0;

	if (pollSocket.revents & POLLOUT)
		*condition |= ENET_SOCKET_WAIT_SEND;

	if (pollSocket.revents & POLLIN)
		*condition |= ENET_SOCKET_WAIT_RECEIVE;

	return 0;
}